

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O1

void test_cpp_db_sqlite::test_execute_invoker(void)

{
  char *pcVar1;
  size_type sVar2;
  test_execute t;
  char local_1f0 [32];
  SQLiteTestFixture local_1d0;
  undefined1 local_1c0 [376];
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1f0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1f0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_execute",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  test_execute_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x90;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  SQLiteTestFixture::SQLiteTestFixture(&local_1d0);
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1f0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1f0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_execute",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  test_execute_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x90;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  SQLiteTestFixture::setup(&local_1d0);
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1f0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1f0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_execute",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  test_execute_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x90;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  test_execute::test_method((test_execute *)&local_1d0);
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1f0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1f0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_execute",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  test_execute_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x90;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  SQLiteTestFixture::teardown(&local_1d0);
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1f0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1f0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_execute",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  test_execute_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x90;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  SQLiteTestFixture::~SQLiteTestFixture(&local_1d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_execute)
{
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 3);
    cpp_db::result r = cpp_db::execute(*con, "select * from TEST_TABLE where COL1 in (?, ?)", 1, 2);
    int64_t sum = 0;
    std::string names;
    while(!r.is_eof())
    {
        sum += cpp_db::value_of<int64_t>(r.get_column_value(0));
        names.append(cpp_db::value_of<std::string>(r.get_column_value(1)));
        r.move_next();
    }
    BOOST_CHECK_EQUAL(sum, 3);
    BOOST_CHECK_EQUAL(names, "firstsecond");

    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)", 1, 2, "first", "second")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE where COL1 = ?", 1));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE"));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 0);
}